

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector_test.cc
# Opt level: O3

void __thiscall
fizplex::DVectorSVectorDotProductTest_ZeroVectors_Test::TestBody
          (DVectorSVectorDotProductTest_ZeroVectors_Test *this)

{
  bool bVar1;
  char *message;
  double rhs_value;
  AssertionResult gtest_ar;
  SVector local_48;
  DVector local_30;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  DVector::DVector(&local_30,5);
  SVector::SVector(&local_48);
  rhs_value = DVector::operator*(&local_30,&local_48);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_18,"0.0","DVector(5) * SVector()",0.0,rhs_value);
  if (local_48.values.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.values.
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_30.vals._M_data);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector_test.cc"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_30.vals._M_size != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30.vals._M_size != (long *)0x0)) {
        (**(code **)(*(long *)local_30.vals._M_size + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(DVectorSVectorDotProductTest, ZeroVectors) {
  EXPECT_DOUBLE_EQ(0.0, DVector(5) * SVector());
}